

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix.c
# Opt level: O1

int Test_SUNMatGetID(SUNMatrix A,SUNMatrix_ID sunid,int myid)

{
  SUNMatrix_ID SVar1;
  int iVar2;
  
  SVar1 = SUNMatGetID();
  sync_device(A);
  if (SVar1 != sunid) {
    if (print_all_ranks == 0 && myid == 0) {
LAB_00101c27:
      puts(">>> FAILED test -- SUNMatGetID ");
    }
    else if (print_all_ranks != 0) {
      printf("process %06d: ",(ulong)(uint)myid);
      goto LAB_00101c27;
    }
    iVar2 = 1;
    goto LAB_00101c38;
  }
  if (print_all_ranks == 0 && myid == 0) {
LAB_00101bfb:
    puts("    PASSED test -- SUNMatGetID ");
  }
  else if (print_all_ranks != 0) {
    printf("process %06d: ",(ulong)(uint)myid);
    goto LAB_00101bfb;
  }
  iVar2 = 0;
  if (myid != 0) {
    return 0;
  }
LAB_00101c38:
  if (print_time != 0) {
    printf("    SUNMatGetID Time: %22.15e \n \n",0);
  }
  return iVar2;
}

Assistant:

int Test_SUNMatGetID(SUNMatrix A, SUNMatrix_ID sunid, int myid)
{
  double start_time, stop_time;
  SUNMatrix_ID mysunid;

  start_time = get_time();
  mysunid    = SUNMatGetID(A);
  sync_device(A);
  stop_time = get_time();

  if (sunid != mysunid)
  {
    TEST_STATUS(">>> FAILED test -- SUNMatGetID \n", myid);
    PRINT_TIME("    SUNMatGetID Time: %22.15e \n \n", stop_time - start_time);
    return (1);
  }
  else { TEST_STATUS("    PASSED test -- SUNMatGetID \n", myid); }

  if (myid == 0)
  {
    PRINT_TIME("    SUNMatGetID Time: %22.15e \n \n", stop_time - start_time);
  }

  return (0);
}